

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O0

bool __thiscall QSharedMemorySystemV::detach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self)

{
  int iVar1;
  int *piVar2;
  char *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView function;
  undefined1 in_stack_000000e0 [16];
  SharedMemoryError in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  char *in_stack_ffffffffffffff58;
  QLatin1String *a;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar3;
  bool local_61;
  QSharedMemoryPrivate *in_stack_ffffffffffffffa0;
  QSharedMemorySystemV *in_stack_ffffffffffffffa8;
  QChar fillChar;
  QSharedMemoryPrivate *in_stack_ffffffffffffffb0;
  QLatin1String local_48 [3];
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = shmdt(*(void **)(in_RSI + 0x78));
  if (iVar1 < 0) {
    local_18.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = Qt::Literals::StringLiterals::operator____L1
                         (in_stack_ffffffffffffff58,
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    fillChar.ucs = (char16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
    piVar2 = __errno_location();
    if (*piVar2 == 0x16) {
      uVar3 = 0;
      a = local_48;
      QSharedMemory::tr(in_RSI,(char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                        ,in_stack_ffffffffffffff4c);
      iVar1 = (int)((ulong)in_RSI >> 0x20);
      QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffb6,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)CONCAT44(uVar3,in_stack_ffffffffffffff68),a,iVar1,fillChar);
      QSharedMemoryPrivate::setError
                ((QSharedMemoryPrivate *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,(QString *)0x8d4252);
      QString::~QString((QString *)0x8d4261);
      QString::~QString((QString *)0x8d426b);
    }
    else {
      QSharedMemoryPrivate::setUnixErrorString
                (in_stack_ffffffffffffffb0,(QLatin1StringView)in_stack_000000e0);
    }
    local_61 = false;
  }
  else {
    in_RSI[0x78] = '\0';
    in_RSI[0x79] = '\0';
    in_RSI[0x7a] = '\0';
    in_RSI[0x7b] = '\0';
    in_RSI[0x7c] = '\0';
    in_RSI[0x7d] = '\0';
    in_RSI[0x7e] = '\0';
    in_RSI[0x7f] = '\0';
    in_RSI[0x80] = '\0';
    in_RSI[0x81] = '\0';
    in_RSI[0x82] = '\0';
    in_RSI[0x83] = '\0';
    in_RSI[0x84] = '\0';
    in_RSI[0x85] = '\0';
    in_RSI[0x86] = '\0';
    in_RSI[0x87] = '\0';
    local_61 = cleanHandle(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::detach(QSharedMemoryPrivate *self)
{
    // detach from the memory segment
    if (shmdt(self->memory) < 0) {
        const auto function = "QSharedMemory::detach"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::NotFound,
                           QSharedMemory::tr("%1: not attached").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }
    self->memory = nullptr;
    self->size = 0;

    return cleanHandle(self);
}